

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall FIX::Initiator::setDisconnected(Initiator *this,SessionID *sessionID)

{
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::erase(&(this->m_pending)._M_t,sessionID);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::erase(&(this->m_connected)._M_t,sessionID);
  std::
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  ::_M_insert_unique<FIX::SessionID_const&>
            ((_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
              *)&this->m_disconnected,sessionID);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void Initiator::setDisconnected(const SessionID &sessionID) {
  Locker l(m_mutex);

  m_pending.erase(sessionID);
  m_connected.erase(sessionID);
  m_disconnected.insert(sessionID);
}